

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Scene::subdivideSelection(Scene *this,bool useCatmullClark)

{
  XFormWidget *pXVar1;
  SceneObject *pSVar2;
  
  pSVar2 = (this->selected).object;
  if (pSVar2 != (SceneObject *)0x0) {
    pSVar2 = (SceneObject *)__dynamic_cast(pSVar2,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    if (pSVar2 != (SceneObject *)0x0) {
      HalfedgeMesh::subdivideQuad((HalfedgeMesh *)(pSVar2 + 1),useCatmullClark);
      (this->hovered).coordinates.z = 0.0;
      (this->hovered).coordinates.x = 0.0;
      (this->hovered).coordinates.y = 0.0;
      (this->hovered).object = (SceneObject *)0x0;
      (this->hovered).element = (HalfedgeElement *)0x0;
      (this->hovered).axis = None;
      (this->selected).element = (HalfedgeElement *)0x0;
      (this->selected).coordinates.x = 0.0;
      (this->selected).coordinates.y = 0.0;
      (this->selected).coordinates.z = 0.0;
      (this->selected).axis = None;
      (this->edited).object = (SceneObject *)0x0;
      (this->edited).element = (HalfedgeElement *)0x0;
      (this->edited).coordinates.x = 0.0;
      (this->edited).coordinates.y = 0.0;
      (this->edited).coordinates.z = 0.0;
      (this->edited).axis = None;
      pXVar1 = this->elementTransform;
      (pXVar1->target).coordinates.z = 0.0;
      (pXVar1->target).coordinates.x = 0.0;
      (pXVar1->target).coordinates.y = 0.0;
      (pXVar1->target).object = (SceneObject *)0x0;
      (pXVar1->target).element = (HalfedgeElement *)0x0;
      (pXVar1->target).axis = None;
      (this->selected).object = pSVar2;
      (this->selected).element = (HalfedgeElement *)((long)pSVar2[1].position.y + 0x10);
    }
  }
  return;
}

Assistant:

void Scene::subdivideSelection(bool useCatmullClark) {
  if (selected.object == nullptr) return;

  Mesh *mesh = dynamic_cast<Mesh *>(selected.object);
  if (mesh) {
    mesh->mesh.subdivideQuad(useCatmullClark);

    // Old elements are invalid
    clearSelections();

    // Select the subdivided mesh again, so that we can keep hitting
    // the same key to get multiple subdivisions (without having to
    // click on a mesh element).
    selected.object = mesh;
    selected.element = elementAddress(mesh->mesh.verticesBegin());
  }
}